

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  int iVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ushort uVar6;
  ushort uVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  byte bVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined4 uVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined4 uVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  Geometry *pGVar70;
  ulong *puVar71;
  uint uVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  undefined4 uVar76;
  undefined8 unaff_RBX;
  long lVar77;
  ulong uVar78;
  uint uVar79;
  uint uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  long lVar85;
  ulong uVar86;
  ulong uVar87;
  long lVar88;
  float fVar89;
  float fVar95;
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar105 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  float fVar125;
  undefined1 auVar128 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar143;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar140 [64];
  float fVar155;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [64];
  float fVar170;
  uint uVar171;
  uint uVar175;
  uint uVar177;
  float fVar178;
  uint uVar179;
  undefined1 auVar172 [16];
  float fVar174;
  float fVar176;
  float fVar180;
  uint uVar181;
  float fVar182;
  uint uVar183;
  float fVar184;
  uint uVar185;
  undefined1 auVar173 [32];
  uint uVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar188 [32];
  float fVar195;
  undefined1 auVar196 [32];
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar197 [64];
  undefined1 auVar204 [32];
  float fVar205;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [32];
  undefined1 auVar213 [32];
  float old_t;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1710;
  undefined1 local_16f0 [16];
  undefined1 (*local_16e0) [16];
  ulong *local_16d8;
  ulong local_16d0;
  ulong local_16c8;
  ulong local_16c0;
  ulong local_16b8;
  ulong local_16b0;
  ulong local_16a8;
  long local_16a0;
  long local_1698;
  ulong local_1690;
  ulong local_1688;
  long local_1680;
  ulong local_1678;
  ulong local_1670;
  ulong local_1668;
  ulong local_1660;
  ulong local_1658;
  ulong local_1650;
  long local_1648;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  RTCFilterFunctionNArguments local_1610;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  undefined1 local_15c0 [16];
  undefined1 auStack_15b0 [16];
  undefined1 local_15a0 [16];
  undefined1 auStack_1590 [16];
  Geometry *local_1580;
  undefined1 auStack_1578 [24];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  int local_1520;
  int iStack_151c;
  int iStack_1518;
  int iStack_1514;
  int iStack_1510;
  int iStack_150c;
  int iStack_1508;
  int iStack_1504;
  float local_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined1 local_1490 [16];
  uint local_1480;
  uint uStack_147c;
  uint uStack_1478;
  uint uStack_1474;
  uint uStack_1470;
  uint uStack_146c;
  uint uStack_1468;
  uint uStack_1464;
  undefined1 local_1460 [8];
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  undefined1 local_1440 [32];
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  uint uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  uint uStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar76 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13c0._4_4_ = uVar76;
  local_13c0._0_4_ = uVar76;
  local_13c0._8_4_ = uVar76;
  local_13c0._12_4_ = uVar76;
  local_13c0._16_4_ = uVar76;
  local_13c0._20_4_ = uVar76;
  local_13c0._24_4_ = uVar76;
  local_13c0._28_4_ = uVar76;
  auVar124 = ZEXT3264(local_13c0);
  uVar76 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_13e0._4_4_ = uVar76;
  local_13e0._0_4_ = uVar76;
  local_13e0._8_4_ = uVar76;
  local_13e0._12_4_ = uVar76;
  local_13e0._16_4_ = uVar76;
  local_13e0._20_4_ = uVar76;
  local_13e0._24_4_ = uVar76;
  local_13e0._28_4_ = uVar76;
  auVar140 = ZEXT3264(local_13e0);
  uVar76 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13a0._4_4_ = uVar76;
  local_13a0._0_4_ = uVar76;
  local_13a0._8_4_ = uVar76;
  local_13a0._12_4_ = uVar76;
  local_13a0._16_4_ = uVar76;
  local_13a0._20_4_ = uVar76;
  local_13a0._24_4_ = uVar76;
  local_13a0._28_4_ = uVar76;
  auVar197 = ZEXT3264(local_13a0);
  fVar125 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar205 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar78 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar81 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar82 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar83 = uVar78 ^ 0x20;
  uVar84 = uVar81 ^ 0x20;
  local_1520 = (tray->tnear).field_0.i[k];
  uVar87 = uVar82 ^ 0x20;
  iVar1 = (tray->tfar).field_0.i[k];
  local_1540._4_4_ = iVar1;
  local_1540._0_4_ = iVar1;
  local_1540._8_4_ = iVar1;
  local_1540._12_4_ = iVar1;
  local_1540._16_4_ = iVar1;
  local_1540._20_4_ = iVar1;
  local_1540._24_4_ = iVar1;
  local_1540._28_4_ = iVar1;
  auVar163 = ZEXT3264(local_1540);
  local_16a8 = uVar78 >> 2;
  local_16b0 = uVar83 >> 2;
  local_1440._0_16_ = mm_lookupmask_ps._0_16_;
  local_1440._16_16_ = mm_lookupmask_ps._240_16_;
  local_16e0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_16b8 = uVar81 >> 2;
  local_16c0 = uVar84 >> 2;
  local_16c8 = uVar82 >> 2;
  local_16d0 = uVar87 >> 2;
  auVar102._8_4_ = 0xbf800000;
  auVar102._0_8_ = 0xbf800000bf800000;
  auVar102._12_4_ = 0xbf800000;
  auVar102._16_4_ = 0xbf800000;
  auVar102._20_4_ = 0xbf800000;
  auVar102._24_4_ = 0xbf800000;
  auVar102._28_4_ = 0xbf800000;
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = 0x3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  _local_1460 = vblendvps_avx(auVar109,auVar102,local_1440);
  puVar71 = local_11f8;
  fVar95 = fVar125;
  fVar96 = fVar125;
  fVar98 = fVar125;
  fVar100 = fVar125;
  fVar97 = fVar125;
  fVar89 = fVar125;
  fVar93 = fVar94;
  fVar99 = fVar94;
  fVar155 = fVar94;
  fVar156 = fVar94;
  fVar157 = fVar94;
  fVar158 = fVar94;
  fVar207 = fVar205;
  fVar208 = fVar205;
  fVar209 = fVar205;
  fVar210 = fVar205;
  fVar211 = fVar205;
  fVar212 = fVar205;
  local_1678 = uVar87;
  local_1670 = uVar84;
  local_1668 = uVar83;
  local_1660 = uVar82;
  local_1658 = uVar81;
  local_1650 = uVar78;
  local_15e0 = fVar205;
  fStack_15dc = fVar205;
  fStack_15d8 = fVar205;
  fStack_15d4 = fVar205;
  fStack_15d0 = fVar205;
  fStack_15cc = fVar205;
  fStack_15c8 = fVar205;
  fStack_15c4 = fVar205;
  iStack_151c = local_1520;
  iStack_1518 = local_1520;
  iStack_1514 = local_1520;
  iStack_1510 = local_1520;
  iStack_150c = local_1520;
  iStack_1508 = local_1520;
  iStack_1504 = local_1520;
  local_1420 = fVar94;
  fStack_141c = fVar94;
  fStack_1418 = fVar94;
  fStack_1414 = fVar94;
  fStack_1410 = fVar94;
  fStack_140c = fVar94;
  fStack_1408 = fVar94;
  fStack_1404 = fVar94;
  local_1400 = fVar125;
  fStack_13fc = fVar125;
  fStack_13f8 = fVar125;
  fStack_13f4 = fVar125;
  fStack_13f0 = fVar125;
  fStack_13ec = fVar125;
  fStack_13e8 = fVar125;
  fStack_13e4 = fVar125;
LAB_01013c02:
  do {
    local_16d8 = puVar71;
    if (local_16d8 == &local_1200) {
LAB_0101486e:
      return local_16d8 != &local_1200;
    }
    local_1710 = local_16d8 + -1;
    uVar86 = local_16d8[-1];
    while ((uVar86 & 8) == 0) {
      auVar102 = vsubps_avx(*(undefined1 (*) [32])(uVar86 + 0x40 + uVar78),auVar124._0_32_);
      auVar9._4_4_ = fVar95 * auVar102._4_4_;
      auVar9._0_4_ = fVar125 * auVar102._0_4_;
      auVar9._8_4_ = fVar96 * auVar102._8_4_;
      auVar9._12_4_ = fVar98 * auVar102._12_4_;
      auVar9._16_4_ = fVar100 * auVar102._16_4_;
      auVar9._20_4_ = fVar97 * auVar102._20_4_;
      auVar9._24_4_ = fVar89 * auVar102._24_4_;
      auVar9._28_4_ = auVar102._28_4_;
      auVar102 = vsubps_avx(*(undefined1 (*) [32])(uVar86 + 0x40 + uVar81),auVar140._0_32_);
      auVar39._4_4_ = fVar93 * auVar102._4_4_;
      auVar39._0_4_ = fVar94 * auVar102._0_4_;
      auVar39._8_4_ = fVar99 * auVar102._8_4_;
      auVar39._12_4_ = fVar155 * auVar102._12_4_;
      auVar39._16_4_ = fVar156 * auVar102._16_4_;
      auVar39._20_4_ = fVar157 * auVar102._20_4_;
      auVar39._24_4_ = fVar158 * auVar102._24_4_;
      auVar39._28_4_ = auVar102._28_4_;
      auVar102 = vmaxps_avx(auVar9,auVar39);
      auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar86 + 0x40 + uVar82),auVar197._0_32_);
      auVar40._4_4_ = fVar207 * auVar109._4_4_;
      auVar40._0_4_ = fVar205 * auVar109._0_4_;
      auVar40._8_4_ = fVar208 * auVar109._8_4_;
      auVar40._12_4_ = fVar209 * auVar109._12_4_;
      auVar40._16_4_ = fVar210 * auVar109._16_4_;
      auVar40._20_4_ = fVar211 * auVar109._20_4_;
      auVar40._24_4_ = fVar212 * auVar109._24_4_;
      auVar40._28_4_ = auVar109._28_4_;
      auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar86 + 0x40 + uVar83),auVar124._0_32_);
      auVar41._4_4_ = fVar95 * auVar109._4_4_;
      auVar41._0_4_ = fVar125 * auVar109._0_4_;
      auVar41._8_4_ = fVar96 * auVar109._8_4_;
      auVar41._12_4_ = fVar98 * auVar109._12_4_;
      auVar41._16_4_ = fVar100 * auVar109._16_4_;
      auVar41._20_4_ = fVar97 * auVar109._20_4_;
      auVar41._24_4_ = fVar89 * auVar109._24_4_;
      auVar41._28_4_ = auVar109._28_4_;
      auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar86 + 0x40 + uVar84),auVar140._0_32_);
      auVar42._4_4_ = fVar93 * auVar109._4_4_;
      auVar42._0_4_ = fVar94 * auVar109._0_4_;
      auVar42._8_4_ = fVar99 * auVar109._8_4_;
      auVar42._12_4_ = fVar155 * auVar109._12_4_;
      auVar42._16_4_ = fVar156 * auVar109._16_4_;
      auVar42._20_4_ = fVar157 * auVar109._20_4_;
      auVar42._24_4_ = fVar158 * auVar109._24_4_;
      auVar42._28_4_ = auVar109._28_4_;
      auVar9 = vminps_avx(auVar41,auVar42);
      auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar86 + 0x40 + uVar87),auVar197._0_32_);
      auVar43._4_4_ = fVar207 * auVar109._4_4_;
      auVar43._0_4_ = fVar205 * auVar109._0_4_;
      auVar43._8_4_ = fVar208 * auVar109._8_4_;
      auVar43._12_4_ = fVar209 * auVar109._12_4_;
      auVar43._16_4_ = fVar210 * auVar109._16_4_;
      auVar43._20_4_ = fVar211 * auVar109._20_4_;
      auVar43._24_4_ = fVar212 * auVar109._24_4_;
      auVar43._28_4_ = auVar109._28_4_;
      auVar44._4_4_ = iStack_151c;
      auVar44._0_4_ = local_1520;
      auVar44._8_4_ = iStack_1518;
      auVar44._12_4_ = iStack_1514;
      auVar44._16_4_ = iStack_1510;
      auVar44._20_4_ = iStack_150c;
      auVar44._24_4_ = iStack_1508;
      auVar44._28_4_ = iStack_1504;
      auVar109 = vmaxps_avx(auVar40,auVar44);
      auVar102 = vmaxps_avx(auVar102,auVar109);
      auVar109 = vminps_avx(auVar43,auVar163._0_32_);
      auVar109 = vminps_avx(auVar9,auVar109);
      auVar102 = vcmpps_avx(auVar102,auVar109,2);
      uVar72 = vmovmskps_avx(auVar102);
      puVar71 = local_1710;
      if (uVar72 == 0) goto LAB_01013c02;
      uVar72 = uVar72 & 0xff;
      uVar73 = uVar86 & 0xfffffffffffffff0;
      lVar74 = 0;
      if (uVar72 != 0) {
        for (; (uVar72 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
        }
      }
      uVar86 = *(ulong *)(uVar73 + lVar74 * 8);
      uVar72 = uVar72 - 1 & uVar72;
      uVar75 = (ulong)uVar72;
      if (uVar72 != 0) {
        do {
          *local_1710 = uVar86;
          local_1710 = local_1710 + 1;
          lVar74 = 0;
          if (uVar75 != 0) {
            for (; (uVar75 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
            }
          }
          uVar86 = *(ulong *)(uVar73 + lVar74 * 8);
          uVar75 = uVar75 - 1 & uVar75;
        } while (uVar75 != 0);
      }
    }
    local_16a0 = (ulong)((uint)uVar86 & 0xf) - 8;
    uVar86 = uVar86 & 0xfffffffffffffff0;
    for (local_1698 = 0; puVar71 = local_1710, local_1698 != local_16a0; local_1698 = local_1698 + 1
        ) {
      lVar74 = local_1698 * 0x90;
      local_1648 = lVar74 + uVar86;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = *(ulong *)(uVar86 + 0x40 + lVar74);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = *(ulong *)(uVar86 + 0x48 + lVar74);
      auVar90 = vpminub_avx(auVar106,auVar90);
      auVar90 = vpcmpeqb_avx(auVar106,auVar90);
      auVar107._8_8_ = 0;
      auVar107._0_8_ = *(ulong *)(uVar86 + 0x44 + lVar74);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = *(ulong *)(uVar86 + 0x4c + lVar74);
      auVar106 = vpminub_avx(auVar107,auVar116);
      auVar106 = vpcmpeqb_avx(auVar107,auVar106);
      fVar2 = *(float *)(uVar86 + 0x70 + lVar74);
      fVar3 = *(float *)(uVar86 + 0x7c + lVar74);
      auVar105._8_8_ = 0;
      auVar105._0_8_ = *(ulong *)(local_16a8 + 0x40 + local_1648);
      auVar107 = vpmovzxbd_avx(auVar105);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = *(ulong *)(local_16a8 + 0x44 + local_1648);
      auVar105 = vpmovzxbd_avx(auVar126);
      auVar110._16_16_ = auVar105;
      auVar110._0_16_ = auVar107;
      auVar102 = vcvtdq2ps_avx(auVar110);
      auVar111._0_4_ = fVar2 + fVar3 * auVar102._0_4_;
      auVar111._4_4_ = fVar2 + fVar3 * auVar102._4_4_;
      auVar111._8_4_ = fVar2 + fVar3 * auVar102._8_4_;
      auVar111._12_4_ = fVar2 + fVar3 * auVar102._12_4_;
      auVar111._16_4_ = fVar2 + fVar3 * auVar102._16_4_;
      auVar111._20_4_ = fVar2 + fVar3 * auVar102._20_4_;
      auVar111._24_4_ = fVar2 + fVar3 * auVar102._24_4_;
      auVar111._28_4_ = fVar2 + auVar102._28_4_;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = *(ulong *)(local_16b0 + 0x40 + local_1648);
      auVar107 = vpmovzxbd_avx(auVar127);
      auVar134._8_8_ = 0;
      auVar134._0_8_ = *(ulong *)(local_16b0 + 0x44 + local_1648);
      auVar105 = vpmovzxbd_avx(auVar134);
      auVar129._16_16_ = auVar105;
      auVar129._0_16_ = auVar107;
      auVar102 = vcvtdq2ps_avx(auVar129);
      auVar117._0_4_ = fVar2 + fVar3 * auVar102._0_4_;
      auVar117._4_4_ = fVar2 + fVar3 * auVar102._4_4_;
      auVar117._8_4_ = fVar2 + fVar3 * auVar102._8_4_;
      auVar117._12_4_ = fVar2 + fVar3 * auVar102._12_4_;
      auVar117._16_4_ = fVar2 + fVar3 * auVar102._16_4_;
      auVar117._20_4_ = fVar2 + fVar3 * auVar102._20_4_;
      auVar117._24_4_ = fVar2 + fVar3 * auVar102._24_4_;
      auVar117._28_4_ = fVar2 + fVar3;
      fVar2 = *(float *)(uVar86 + 0x74 + lVar74);
      fVar3 = *(float *)(uVar86 + 0x80 + lVar74);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = *(ulong *)(local_16b8 + 0x40 + local_1648);
      auVar107 = vpmovzxbd_avx(auVar120);
      auVar147._8_8_ = 0;
      auVar147._0_8_ = *(ulong *)(local_16b8 + 0x44 + local_1648);
      auVar105 = vpmovzxbd_avx(auVar147);
      auVar121._16_16_ = auVar105;
      auVar121._0_16_ = auVar107;
      auVar102 = vcvtdq2ps_avx(auVar121);
      auVar122._0_4_ = fVar2 + fVar3 * auVar102._0_4_;
      auVar122._4_4_ = fVar2 + fVar3 * auVar102._4_4_;
      auVar122._8_4_ = fVar2 + fVar3 * auVar102._8_4_;
      auVar122._12_4_ = fVar2 + fVar3 * auVar102._12_4_;
      auVar122._16_4_ = fVar2 + fVar3 * auVar102._16_4_;
      auVar122._20_4_ = fVar2 + fVar3 * auVar102._20_4_;
      auVar122._24_4_ = fVar2 + fVar3 * auVar102._24_4_;
      auVar122._28_4_ = fVar2 + auVar102._28_4_;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = *(ulong *)(local_16c0 + 0x40 + local_1648);
      auVar107 = vpmovzxbd_avx(auVar148);
      auVar160._8_8_ = 0;
      auVar160._0_8_ = *(ulong *)(local_16c0 + 0x44 + local_1648);
      auVar105 = vpmovzxbd_avx(auVar160);
      auVar151._16_16_ = auVar105;
      auVar151._0_16_ = auVar107;
      auVar102 = vcvtdq2ps_avx(auVar151);
      auVar130._0_4_ = fVar2 + fVar3 * auVar102._0_4_;
      auVar130._4_4_ = fVar2 + fVar3 * auVar102._4_4_;
      auVar130._8_4_ = fVar2 + fVar3 * auVar102._8_4_;
      auVar130._12_4_ = fVar2 + fVar3 * auVar102._12_4_;
      auVar130._16_4_ = fVar2 + fVar3 * auVar102._16_4_;
      auVar130._20_4_ = fVar2 + fVar3 * auVar102._20_4_;
      auVar130._24_4_ = fVar2 + fVar3 * auVar102._24_4_;
      auVar130._28_4_ = fVar2 + fVar3;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = *(ulong *)(local_16c8 + 0x40 + local_1648);
      auVar107 = vpmovzxbd_avx(auVar135);
      auVar149._8_8_ = 0;
      auVar149._0_8_ = *(ulong *)(local_16c8 + 0x44 + local_1648);
      auVar105 = vpmovzxbd_avx(auVar149);
      auVar136._16_16_ = auVar105;
      auVar136._0_16_ = auVar107;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = *(ulong *)(local_16d0 + 0x40 + local_1648);
      auVar107 = vpmovzxbd_avx(auVar150);
      auVar161._8_8_ = 0;
      auVar161._0_8_ = *(ulong *)(local_16d0 + 0x44 + local_1648);
      auVar105 = vpmovzxbd_avx(auVar161);
      auVar152._16_16_ = auVar105;
      auVar152._0_16_ = auVar107;
      fVar2 = *(float *)(uVar86 + 0x84 + lVar74);
      auVar102 = vcvtdq2ps_avx(auVar136);
      auVar109 = vcvtdq2ps_avx(auVar152);
      fVar3 = *(float *)(uVar86 + 0x78 + lVar74);
      auVar137._0_4_ = fVar3 + fVar2 * auVar102._0_4_;
      auVar137._4_4_ = fVar3 + fVar2 * auVar102._4_4_;
      auVar137._8_4_ = fVar3 + fVar2 * auVar102._8_4_;
      auVar137._12_4_ = fVar3 + fVar2 * auVar102._12_4_;
      auVar137._16_4_ = fVar3 + fVar2 * auVar102._16_4_;
      auVar137._20_4_ = fVar3 + fVar2 * auVar102._20_4_;
      auVar137._24_4_ = fVar3 + fVar2 * auVar102._24_4_;
      auVar137._28_4_ = fVar3 + auVar102._28_4_;
      auVar153._0_4_ = fVar3 + fVar2 * auVar109._0_4_;
      auVar153._4_4_ = fVar3 + fVar2 * auVar109._4_4_;
      auVar153._8_4_ = fVar3 + fVar2 * auVar109._8_4_;
      auVar153._12_4_ = fVar3 + fVar2 * auVar109._12_4_;
      auVar153._16_4_ = fVar3 + fVar2 * auVar109._16_4_;
      auVar153._20_4_ = fVar3 + fVar2 * auVar109._20_4_;
      auVar153._24_4_ = fVar3 + fVar2 * auVar109._24_4_;
      auVar153._28_4_ = fVar3 + auVar109._28_4_;
      auVar102 = vsubps_avx(auVar111,auVar124._0_32_);
      auVar45._4_4_ = fVar95 * auVar102._4_4_;
      auVar45._0_4_ = fVar125 * auVar102._0_4_;
      auVar45._8_4_ = fVar96 * auVar102._8_4_;
      auVar45._12_4_ = fVar98 * auVar102._12_4_;
      auVar45._16_4_ = fVar100 * auVar102._16_4_;
      auVar45._20_4_ = fVar97 * auVar102._20_4_;
      auVar45._24_4_ = fVar89 * auVar102._24_4_;
      auVar45._28_4_ = auVar102._28_4_;
      auVar102 = vsubps_avx(auVar122,auVar140._0_32_);
      auVar46._4_4_ = fVar93 * auVar102._4_4_;
      auVar46._0_4_ = fVar94 * auVar102._0_4_;
      auVar46._8_4_ = fVar99 * auVar102._8_4_;
      auVar46._12_4_ = fVar155 * auVar102._12_4_;
      auVar46._16_4_ = fVar156 * auVar102._16_4_;
      auVar46._20_4_ = fVar157 * auVar102._20_4_;
      auVar46._24_4_ = fVar158 * auVar102._24_4_;
      auVar46._28_4_ = auVar102._28_4_;
      auVar102 = vmaxps_avx(auVar45,auVar46);
      auVar109 = vsubps_avx(auVar117,auVar124._0_32_);
      auVar47._4_4_ = fVar95 * auVar109._4_4_;
      auVar47._0_4_ = fVar125 * auVar109._0_4_;
      auVar47._8_4_ = fVar96 * auVar109._8_4_;
      auVar47._12_4_ = fVar98 * auVar109._12_4_;
      auVar47._16_4_ = fVar100 * auVar109._16_4_;
      auVar47._20_4_ = fVar97 * auVar109._20_4_;
      auVar47._24_4_ = fVar89 * auVar109._24_4_;
      auVar47._28_4_ = auVar109._28_4_;
      auVar109 = vsubps_avx(auVar130,auVar140._0_32_);
      auVar49._4_4_ = fVar93 * auVar109._4_4_;
      auVar49._0_4_ = fVar94 * auVar109._0_4_;
      auVar49._8_4_ = fVar99 * auVar109._8_4_;
      auVar49._12_4_ = fVar155 * auVar109._12_4_;
      auVar49._16_4_ = fVar156 * auVar109._16_4_;
      auVar49._20_4_ = fVar157 * auVar109._20_4_;
      auVar49._24_4_ = fVar158 * auVar109._24_4_;
      auVar49._28_4_ = auVar109._28_4_;
      auVar9 = vminps_avx(auVar47,auVar49);
      auVar109 = vsubps_avx(auVar137,auVar197._0_32_);
      auVar50._4_4_ = fVar207 * auVar109._4_4_;
      auVar50._0_4_ = fVar205 * auVar109._0_4_;
      auVar50._8_4_ = fVar208 * auVar109._8_4_;
      auVar50._12_4_ = fVar209 * auVar109._12_4_;
      auVar50._16_4_ = fVar210 * auVar109._16_4_;
      auVar50._20_4_ = fVar211 * auVar109._20_4_;
      auVar50._24_4_ = fVar212 * auVar109._24_4_;
      auVar50._28_4_ = auVar109._28_4_;
      auVar69._4_4_ = iStack_151c;
      auVar69._0_4_ = local_1520;
      auVar69._8_4_ = iStack_1518;
      auVar69._12_4_ = iStack_1514;
      auVar69._16_4_ = iStack_1510;
      auVar69._20_4_ = iStack_150c;
      auVar69._24_4_ = iStack_1508;
      auVar69._28_4_ = iStack_1504;
      auVar109 = vmaxps_avx(auVar50,auVar69);
      auVar102 = vmaxps_avx(auVar102,auVar109);
      auVar109 = vsubps_avx(auVar153,auVar197._0_32_);
      auVar51._4_4_ = fVar207 * auVar109._4_4_;
      auVar51._0_4_ = fVar205 * auVar109._0_4_;
      auVar51._8_4_ = fVar208 * auVar109._8_4_;
      auVar51._12_4_ = fVar209 * auVar109._12_4_;
      auVar51._16_4_ = fVar210 * auVar109._16_4_;
      auVar51._20_4_ = fVar211 * auVar109._20_4_;
      auVar51._24_4_ = fVar212 * auVar109._24_4_;
      auVar51._28_4_ = auVar109._28_4_;
      auVar109 = vminps_avx(auVar51,local_1540);
      auVar109 = vminps_avx(auVar9,auVar109);
      auVar102 = vcmpps_avx(auVar102,auVar109,2);
      auVar107 = vpcmpeqd_avx(auVar109._0_16_,auVar109._0_16_);
      auVar90 = vpmovsxbd_avx(auVar90 ^ auVar107);
      auVar106 = vpmovsxbd_avx(auVar106 ^ auVar107);
      auVar91._16_16_ = auVar106;
      auVar91._0_16_ = auVar90;
      auVar109 = vcvtdq2ps_avx(auVar91);
      auVar103._8_4_ = 0xbf800000;
      auVar103._0_8_ = 0xbf800000bf800000;
      auVar103._12_4_ = 0xbf800000;
      auVar103._16_4_ = 0xbf800000;
      auVar103._20_4_ = 0xbf800000;
      auVar103._24_4_ = 0xbf800000;
      auVar103._28_4_ = 0xbf800000;
      auVar109 = vcmpps_avx(auVar103,auVar109,1);
      auVar102 = vandps_avx(auVar102,auVar109);
      uVar76 = vmovmskps_avx(auVar102);
      for (uVar73 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),uVar76);
          auVar163 = ZEXT3264(local_1540), uVar73 != 0; uVar73 = uVar73 & uVar73 - 1) {
        lVar74 = 0;
        if (uVar73 != 0) {
          for (; (uVar73 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
          }
        }
        uVar6 = *(ushort *)(local_1648 + lVar74 * 8);
        uVar7 = *(ushort *)(local_1648 + 2 + lVar74 * 8);
        local_1688 = (ulong)*(uint *)(local_1648 + 0x88);
        uVar72 = *(uint *)(local_1648 + 4 + lVar74 * 8);
        local_1690 = (ulong)uVar72;
        local_1580 = (context->scene->geometries).items[local_1688].ptr;
        local_1680 = *(long *)&local_1580->field_0x58;
        lVar77 = local_1580[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 local_1690;
        uVar79 = uVar6 & 0x7fff;
        uVar80 = uVar7 & 0x7fff;
        uVar171 = *(uint *)(local_1680 + 4 + lVar77);
        uVar82 = (ulong)uVar171;
        uVar81 = (ulong)(uVar171 * uVar80 + *(int *)(local_1680 + lVar77) + uVar79);
        p_Var8 = local_1580[1].intersectionFilterN;
        lVar74 = *(long *)&local_1580[1].time_range.upper;
        auVar90 = *(undefined1 (*) [16])(lVar74 + (long)p_Var8 * uVar81);
        auVar106 = *(undefined1 (*) [16])(lVar74 + (uVar81 + 1) * (long)p_Var8);
        auVar107 = *(undefined1 (*) [16])(lVar74 + (uVar81 + uVar82) * (long)p_Var8);
        lVar88 = uVar81 + uVar82 + 1;
        auVar105 = *(undefined1 (*) [16])(lVar74 + lVar88 * (long)p_Var8);
        uVar78 = (ulong)(-1 < (short)uVar6);
        auVar116 = *(undefined1 (*) [16])(lVar74 + (uVar81 + uVar78 + 1) * (long)p_Var8);
        lVar85 = uVar78 + lVar88;
        auVar120 = *(undefined1 (*) [16])(lVar74 + lVar85 * (long)p_Var8);
        uVar78 = 0;
        if (-1 < (short)uVar7) {
          uVar78 = uVar82;
        }
        auVar126 = *(undefined1 (*) [16])(lVar74 + (uVar81 + uVar82 + uVar78) * (long)p_Var8);
        auVar127 = *(undefined1 (*) [16])(lVar74 + (lVar88 + uVar78) * (long)p_Var8);
        auVar134 = *(undefined1 (*) [16])(lVar74 + (uVar78 + lVar85) * (long)p_Var8);
        auVar147 = vunpcklps_avx(auVar90,auVar105);
        auVar90 = vunpckhps_avx(auVar90,auVar105);
        auVar148 = vunpcklps_avx(auVar106,auVar107);
        auVar135 = vunpckhps_avx(auVar106,auVar107);
        auVar135 = vunpcklps_avx(auVar90,auVar135);
        auVar149 = vunpcklps_avx(auVar147,auVar148);
        auVar90 = vunpckhps_avx(auVar147,auVar148);
        auVar147 = vunpcklps_avx(auVar106,auVar120);
        auVar106 = vunpckhps_avx(auVar106,auVar120);
        auVar148 = vunpcklps_avx(auVar116,auVar105);
        auVar116 = vunpckhps_avx(auVar116,auVar105);
        auVar150 = vunpcklps_avx(auVar106,auVar116);
        auVar160 = vunpcklps_avx(auVar147,auVar148);
        auVar106 = vunpckhps_avx(auVar147,auVar148);
        auVar147 = vunpcklps_avx(auVar105,auVar134);
        auVar116 = vunpckhps_avx(auVar105,auVar134);
        auVar134 = vunpcklps_avx(auVar120,auVar127);
        auVar120 = vunpckhps_avx(auVar120,auVar127);
        auVar120 = vunpcklps_avx(auVar116,auVar120);
        auVar148 = vunpcklps_avx(auVar147,auVar134);
        auVar116 = vunpckhps_avx(auVar147,auVar134);
        auVar134 = vunpcklps_avx(auVar107,auVar127);
        auVar107 = vunpckhps_avx(auVar107,auVar127);
        auVar127 = vunpcklps_avx(auVar105,auVar126);
        auVar105 = vunpckhps_avx(auVar105,auVar126);
        auVar105 = vunpcklps_avx(auVar107,auVar105);
        auVar126 = vunpcklps_avx(auVar134,auVar127);
        auVar107 = vunpckhps_avx(auVar134,auVar127);
        auVar104._16_16_ = auVar148;
        auVar104._0_16_ = auVar149;
        auVar123._16_16_ = auVar116;
        auVar123._0_16_ = auVar90;
        auVar162._16_16_ = auVar120;
        auVar162._0_16_ = auVar135;
        auVar118._16_16_ = auVar160;
        auVar118._0_16_ = auVar160;
        auVar131._16_16_ = auVar106;
        auVar131._0_16_ = auVar106;
        auVar112._16_16_ = auVar150;
        auVar112._0_16_ = auVar150;
        auVar173._16_16_ = auVar126;
        auVar173._0_16_ = auVar126;
        auVar188._16_16_ = auVar107;
        auVar188._0_16_ = auVar107;
        auVar196._16_16_ = auVar105;
        auVar196._0_16_ = auVar105;
        auVar9 = vsubps_avx(auVar104,auVar118);
        auVar39 = vsubps_avx(auVar123,auVar131);
        auVar102 = vsubps_avx(auVar162,auVar112);
        auVar109 = vsubps_avx(auVar173,auVar104);
        auVar40 = vsubps_avx(auVar188,auVar123);
        auVar41 = vsubps_avx(auVar196,auVar162);
        fVar95 = auVar39._0_4_;
        fVar195 = auVar41._0_4_;
        fVar99 = auVar39._4_4_;
        fVar198 = auVar41._4_4_;
        auVar52._4_4_ = fVar198 * fVar99;
        auVar52._0_4_ = fVar195 * fVar95;
        fVar207 = auVar39._8_4_;
        fVar199 = auVar41._8_4_;
        auVar52._8_4_ = fVar199 * fVar207;
        fVar210 = auVar39._12_4_;
        fVar200 = auVar41._12_4_;
        auVar52._12_4_ = fVar200 * fVar210;
        fVar18 = auVar39._16_4_;
        fVar201 = auVar41._16_4_;
        auVar52._16_4_ = fVar201 * fVar18;
        fVar25 = auVar39._20_4_;
        fVar202 = auVar41._20_4_;
        auVar52._20_4_ = fVar202 * fVar25;
        fVar32 = auVar39._24_4_;
        fVar203 = auVar41._24_4_;
        auVar52._24_4_ = fVar203 * fVar32;
        auVar52._28_4_ = auVar150._12_4_;
        fVar96 = auVar102._0_4_;
        fVar187 = auVar40._0_4_;
        fVar155 = auVar102._4_4_;
        fVar189 = auVar40._4_4_;
        auVar54._4_4_ = fVar189 * fVar155;
        auVar54._0_4_ = fVar187 * fVar96;
        fVar208 = auVar102._8_4_;
        fVar190 = auVar40._8_4_;
        auVar54._8_4_ = fVar190 * fVar208;
        fVar211 = auVar102._12_4_;
        fVar191 = auVar40._12_4_;
        auVar54._12_4_ = fVar191 * fVar211;
        fVar19 = auVar102._16_4_;
        fVar192 = auVar40._16_4_;
        auVar54._16_4_ = fVar192 * fVar19;
        fVar26 = auVar102._20_4_;
        fVar193 = auVar40._20_4_;
        auVar54._20_4_ = fVar193 * fVar26;
        fVar33 = auVar102._24_4_;
        uVar53 = auVar160._12_4_;
        fVar194 = auVar40._24_4_;
        auVar54._24_4_ = fVar194 * fVar33;
        auVar54._28_4_ = uVar53;
        auVar42 = vsubps_avx(auVar54,auVar52);
        fVar170 = auVar109._0_4_;
        fVar174 = auVar109._4_4_;
        auVar55._4_4_ = fVar174 * fVar155;
        auVar55._0_4_ = fVar170 * fVar96;
        fVar176 = auVar109._8_4_;
        auVar55._8_4_ = fVar176 * fVar208;
        fVar178 = auVar109._12_4_;
        auVar55._12_4_ = fVar178 * fVar211;
        fVar180 = auVar109._16_4_;
        auVar55._16_4_ = fVar180 * fVar19;
        fVar182 = auVar109._20_4_;
        auVar55._20_4_ = fVar182 * fVar26;
        fVar184 = auVar109._24_4_;
        auVar55._24_4_ = fVar184 * fVar33;
        auVar55._28_4_ = uVar53;
        fVar98 = auVar9._0_4_;
        fVar156 = auVar9._4_4_;
        auVar57._4_4_ = fVar198 * fVar156;
        auVar57._0_4_ = fVar195 * fVar98;
        fVar209 = auVar9._8_4_;
        auVar57._8_4_ = fVar199 * fVar209;
        fVar212 = auVar9._12_4_;
        auVar57._12_4_ = fVar200 * fVar212;
        fVar20 = auVar9._16_4_;
        auVar57._16_4_ = fVar201 * fVar20;
        fVar27 = auVar9._20_4_;
        auVar57._20_4_ = fVar202 * fVar27;
        fVar34 = auVar9._24_4_;
        uVar56 = auVar106._12_4_;
        auVar57._24_4_ = fVar203 * fVar34;
        auVar57._28_4_ = uVar56;
        auVar102 = vsubps_avx(auVar57,auVar55);
        auVar58._4_4_ = fVar189 * fVar156;
        auVar58._0_4_ = fVar187 * fVar98;
        auVar58._8_4_ = fVar190 * fVar209;
        auVar58._12_4_ = fVar191 * fVar212;
        auVar58._16_4_ = fVar192 * fVar20;
        auVar58._20_4_ = fVar193 * fVar27;
        auVar58._24_4_ = fVar194 * fVar34;
        auVar58._28_4_ = uVar56;
        auVar59._4_4_ = fVar174 * fVar99;
        auVar59._0_4_ = fVar170 * fVar95;
        auVar59._8_4_ = fVar176 * fVar207;
        auVar59._12_4_ = fVar178 * fVar210;
        auVar59._16_4_ = fVar180 * fVar18;
        auVar59._20_4_ = fVar182 * fVar25;
        auVar59._24_4_ = fVar184 * fVar32;
        auVar59._28_4_ = auVar39._28_4_;
        uVar76 = *(undefined4 *)(ray + k * 4);
        auVar204._4_4_ = uVar76;
        auVar204._0_4_ = uVar76;
        auVar204._8_4_ = uVar76;
        auVar204._12_4_ = uVar76;
        auVar204._16_4_ = uVar76;
        auVar204._20_4_ = uVar76;
        auVar204._24_4_ = uVar76;
        auVar204._28_4_ = uVar76;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar206._4_4_ = uVar4;
        auVar206._0_4_ = uVar4;
        auVar206._8_4_ = uVar4;
        auVar206._12_4_ = uVar4;
        auVar206._16_4_ = uVar4;
        auVar206._20_4_ = uVar4;
        auVar206._24_4_ = uVar4;
        auVar206._28_4_ = uVar4;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar213._4_4_ = uVar5;
        auVar213._0_4_ = uVar5;
        auVar213._8_4_ = uVar5;
        auVar213._12_4_ = uVar5;
        auVar213._16_4_ = uVar5;
        auVar213._20_4_ = uVar5;
        auVar213._24_4_ = uVar5;
        auVar213._28_4_ = uVar5;
        fVar125 = *(float *)(ray + k * 4 + 0x50);
        local_1560 = vsubps_avx(auVar59,auVar58);
        auVar43 = vsubps_avx(auVar104,auVar204);
        fVar94 = *(float *)(ray + k * 4 + 0x60);
        auVar44 = vsubps_avx(auVar123,auVar206);
        auVar45 = vsubps_avx(auVar162,auVar213);
        fVar159 = auVar45._0_4_;
        fVar164 = auVar45._4_4_;
        auVar60._4_4_ = fVar164 * fVar125;
        auVar60._0_4_ = fVar159 * fVar125;
        fVar165 = auVar45._8_4_;
        auVar60._8_4_ = fVar165 * fVar125;
        fVar166 = auVar45._12_4_;
        auVar60._12_4_ = fVar166 * fVar125;
        fVar167 = auVar45._16_4_;
        auVar60._16_4_ = fVar167 * fVar125;
        fVar168 = auVar45._20_4_;
        auVar60._20_4_ = fVar168 * fVar125;
        fVar169 = auVar45._24_4_;
        auVar60._24_4_ = fVar169 * fVar125;
        auVar60._28_4_ = uVar76;
        fVar100 = auVar44._0_4_;
        fVar157 = auVar44._4_4_;
        auVar61._4_4_ = fVar94 * fVar157;
        auVar61._0_4_ = fVar94 * fVar100;
        fVar10 = auVar44._8_4_;
        auVar61._8_4_ = fVar94 * fVar10;
        fVar14 = auVar44._12_4_;
        auVar61._12_4_ = fVar94 * fVar14;
        fVar21 = auVar44._16_4_;
        auVar61._16_4_ = fVar94 * fVar21;
        fVar28 = auVar44._20_4_;
        auVar61._20_4_ = fVar94 * fVar28;
        fVar35 = auVar44._24_4_;
        auVar61._24_4_ = fVar94 * fVar35;
        auVar61._28_4_ = uVar4;
        auVar45 = vsubps_avx(auVar61,auVar60);
        fVar205 = *(float *)(ray + k * 4 + 0x40);
        fVar97 = auVar43._0_4_;
        fVar158 = auVar43._4_4_;
        auVar62._4_4_ = fVar94 * fVar158;
        auVar62._0_4_ = fVar94 * fVar97;
        fVar11 = auVar43._8_4_;
        auVar62._8_4_ = fVar94 * fVar11;
        fVar15 = auVar43._12_4_;
        auVar62._12_4_ = fVar94 * fVar15;
        fVar22 = auVar43._16_4_;
        auVar62._16_4_ = fVar94 * fVar22;
        fVar29 = auVar43._20_4_;
        auVar62._20_4_ = fVar94 * fVar29;
        fVar36 = auVar43._24_4_;
        auVar62._24_4_ = fVar94 * fVar36;
        auVar62._28_4_ = uVar5;
        auVar63._4_4_ = fVar164 * fVar205;
        auVar63._0_4_ = fVar159 * fVar205;
        auVar63._8_4_ = fVar165 * fVar205;
        auVar63._12_4_ = fVar166 * fVar205;
        auVar63._16_4_ = fVar167 * fVar205;
        auVar63._20_4_ = fVar168 * fVar205;
        auVar63._24_4_ = fVar169 * fVar205;
        auVar63._28_4_ = uVar53;
        auVar46 = vsubps_avx(auVar63,auVar62);
        auVar64._4_4_ = fVar205 * fVar157;
        auVar64._0_4_ = fVar205 * fVar100;
        auVar64._8_4_ = fVar205 * fVar10;
        auVar64._12_4_ = fVar205 * fVar14;
        auVar64._16_4_ = fVar205 * fVar21;
        auVar64._20_4_ = fVar205 * fVar28;
        auVar64._24_4_ = fVar205 * fVar35;
        auVar64._28_4_ = uVar5;
        auVar65._4_4_ = fVar158 * fVar125;
        auVar65._0_4_ = fVar97 * fVar125;
        auVar65._8_4_ = fVar11 * fVar125;
        auVar65._12_4_ = fVar15 * fVar125;
        auVar65._16_4_ = fVar22 * fVar125;
        auVar65._20_4_ = fVar29 * fVar125;
        auVar65._24_4_ = fVar36 * fVar125;
        auVar65._28_4_ = uVar56;
        auVar47 = vsubps_avx(auVar65,auVar64);
        fVar89 = local_1560._0_4_;
        fVar2 = local_1560._4_4_;
        fVar12 = local_1560._8_4_;
        fVar16 = local_1560._12_4_;
        fVar23 = local_1560._16_4_;
        fVar30 = local_1560._20_4_;
        fVar37 = local_1560._24_4_;
        fVar133 = auVar102._0_4_;
        fVar141 = auVar102._4_4_;
        fVar142 = auVar102._8_4_;
        fVar143 = auVar102._12_4_;
        fVar144 = auVar102._16_4_;
        fVar145 = auVar102._20_4_;
        fVar146 = auVar102._24_4_;
        fVar93 = auVar42._0_4_;
        fVar3 = auVar42._4_4_;
        fVar13 = auVar42._8_4_;
        fVar17 = auVar42._12_4_;
        fVar24 = auVar42._16_4_;
        fVar31 = auVar42._20_4_;
        fVar38 = auVar42._24_4_;
        auVar113._0_4_ = fVar205 * fVar93 + fVar94 * fVar89 + fVar133 * fVar125;
        auVar113._4_4_ = fVar205 * fVar3 + fVar94 * fVar2 + fVar141 * fVar125;
        auVar113._8_4_ = fVar205 * fVar13 + fVar94 * fVar12 + fVar142 * fVar125;
        auVar113._12_4_ = fVar205 * fVar17 + fVar94 * fVar16 + fVar143 * fVar125;
        auVar113._16_4_ = fVar205 * fVar24 + fVar94 * fVar23 + fVar144 * fVar125;
        auVar113._20_4_ = fVar205 * fVar31 + fVar94 * fVar30 + fVar145 * fVar125;
        auVar113._24_4_ = fVar205 * fVar38 + fVar94 * fVar37 + fVar146 * fVar125;
        auVar113._28_4_ = fVar94 + fVar94 + fVar125;
        auVar132._8_4_ = 0x80000000;
        auVar132._0_8_ = 0x8000000080000000;
        auVar132._12_4_ = 0x80000000;
        auVar132._16_4_ = 0x80000000;
        auVar132._20_4_ = 0x80000000;
        auVar132._24_4_ = 0x80000000;
        auVar132._28_4_ = 0x80000000;
        auVar102 = vandps_avx(auVar113,auVar132);
        uVar171 = auVar102._0_4_;
        auVar138._0_4_ =
             (float)(uVar171 ^
                    (uint)(fVar170 * auVar45._0_4_ +
                          fVar195 * auVar47._0_4_ + fVar187 * auVar46._0_4_));
        uVar175 = auVar102._4_4_;
        auVar138._4_4_ =
             (float)(uVar175 ^
                    (uint)(fVar174 * auVar45._4_4_ +
                          fVar198 * auVar47._4_4_ + fVar189 * auVar46._4_4_));
        uVar177 = auVar102._8_4_;
        auVar138._8_4_ =
             (float)(uVar177 ^
                    (uint)(fVar176 * auVar45._8_4_ +
                          fVar199 * auVar47._8_4_ + fVar190 * auVar46._8_4_));
        uVar179 = auVar102._12_4_;
        auVar138._12_4_ =
             (float)(uVar179 ^
                    (uint)(fVar178 * auVar45._12_4_ +
                          fVar200 * auVar47._12_4_ + fVar191 * auVar46._12_4_));
        uVar181 = auVar102._16_4_;
        auVar138._16_4_ =
             (float)(uVar181 ^
                    (uint)(fVar180 * auVar45._16_4_ +
                          fVar201 * auVar47._16_4_ + fVar192 * auVar46._16_4_));
        uVar183 = auVar102._20_4_;
        auVar138._20_4_ =
             (float)(uVar183 ^
                    (uint)(fVar182 * auVar45._20_4_ +
                          fVar202 * auVar47._20_4_ + fVar193 * auVar46._20_4_));
        uVar185 = auVar102._24_4_;
        auVar138._24_4_ =
             (float)(uVar185 ^
                    (uint)(fVar184 * auVar45._24_4_ +
                          fVar203 * auVar47._24_4_ + fVar194 * auVar46._24_4_));
        uVar186 = auVar102._28_4_;
        auVar138._28_4_ =
             (float)(uVar186 ^ (uint)(auVar109._28_4_ + auVar41._28_4_ + auVar40._28_4_));
        auVar154._0_4_ =
             (float)(uVar171 ^
                    (uint)(auVar45._0_4_ * fVar98 + fVar96 * auVar47._0_4_ + auVar46._0_4_ * fVar95)
                    );
        auVar154._4_4_ =
             (float)(uVar175 ^
                    (uint)(auVar45._4_4_ * fVar156 +
                          fVar155 * auVar47._4_4_ + auVar46._4_4_ * fVar99));
        auVar154._8_4_ =
             (float)(uVar177 ^
                    (uint)(auVar45._8_4_ * fVar209 +
                          fVar208 * auVar47._8_4_ + auVar46._8_4_ * fVar207));
        auVar154._12_4_ =
             (float)(uVar179 ^
                    (uint)(auVar45._12_4_ * fVar212 +
                          fVar211 * auVar47._12_4_ + auVar46._12_4_ * fVar210));
        auVar154._16_4_ =
             (float)(uVar181 ^
                    (uint)(auVar45._16_4_ * fVar20 +
                          fVar19 * auVar47._16_4_ + auVar46._16_4_ * fVar18));
        auVar154._20_4_ =
             (float)(uVar183 ^
                    (uint)(auVar45._20_4_ * fVar27 +
                          fVar26 * auVar47._20_4_ + auVar46._20_4_ * fVar25));
        auVar154._24_4_ =
             (float)(uVar185 ^
                    (uint)(auVar45._24_4_ * fVar34 +
                          fVar33 * auVar47._24_4_ + auVar46._24_4_ * fVar32));
        auVar154._28_4_ =
             (float)(uVar186 ^ (uint)(auVar42._28_4_ + auVar47._28_4_ + auVar46._28_4_));
        auVar109 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar102 = vcmpps_avx(auVar138,auVar109,5);
        auVar109 = vcmpps_avx(auVar154,auVar109,5);
        auVar102 = vandps_avx(auVar102,auVar109);
        auVar92._8_4_ = 0x7fffffff;
        auVar92._0_8_ = 0x7fffffff7fffffff;
        auVar92._12_4_ = 0x7fffffff;
        auVar92._16_4_ = 0x7fffffff;
        auVar92._20_4_ = 0x7fffffff;
        auVar92._24_4_ = 0x7fffffff;
        auVar92._28_4_ = 0x7fffffff;
        local_1320 = vandps_avx(auVar113,auVar92);
        auVar109 = vcmpps_avx(auVar113,ZEXT1232(ZEXT812(0)) << 0x20,4);
        auVar102 = vandps_avx(auVar102,auVar109);
        auVar114._0_4_ = auVar138._0_4_ + auVar154._0_4_;
        auVar114._4_4_ = auVar138._4_4_ + auVar154._4_4_;
        auVar114._8_4_ = auVar138._8_4_ + auVar154._8_4_;
        auVar114._12_4_ = auVar138._12_4_ + auVar154._12_4_;
        auVar114._16_4_ = auVar138._16_4_ + auVar154._16_4_;
        auVar114._20_4_ = auVar138._20_4_ + auVar154._20_4_;
        auVar114._24_4_ = auVar138._24_4_ + auVar154._24_4_;
        auVar114._28_4_ = auVar138._28_4_ + auVar154._28_4_;
        auVar109 = vcmpps_avx(auVar114,local_1320,2);
        auVar40 = auVar109 & auVar102;
        fVar205 = local_15e0;
        fVar207 = fStack_15dc;
        fVar208 = fStack_15d8;
        fVar209 = fStack_15d4;
        fVar210 = fStack_15d0;
        fVar211 = fStack_15cc;
        fVar212 = fStack_15c8;
        if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar40 >> 0x7f,0) != '\0') ||
              (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar40 >> 0xbf,0) != '\0') ||
            (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar40[0x1f] < '\0') {
          auVar102 = vandps_avx(auVar102,auVar109);
          auVar90 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
          local_1340._0_4_ =
               (float)(uVar171 ^ (uint)(fVar93 * fVar97 + fVar100 * fVar133 + fVar159 * fVar89));
          local_1340._4_4_ =
               (float)(uVar175 ^ (uint)(fVar3 * fVar158 + fVar157 * fVar141 + fVar164 * fVar2));
          local_1340._8_4_ =
               (float)(uVar177 ^ (uint)(fVar13 * fVar11 + fVar10 * fVar142 + fVar165 * fVar12));
          local_1340._12_4_ =
               (float)(uVar179 ^ (uint)(fVar17 * fVar15 + fVar14 * fVar143 + fVar166 * fVar16));
          local_1340._16_4_ =
               (float)(uVar181 ^ (uint)(fVar24 * fVar22 + fVar21 * fVar144 + fVar167 * fVar23));
          local_1340._20_4_ =
               (float)(uVar183 ^ (uint)(fVar31 * fVar29 + fVar28 * fVar145 + fVar168 * fVar30));
          local_1340._24_4_ =
               (float)(uVar185 ^ (uint)(fVar38 * fVar36 + fVar35 * fVar146 + fVar169 * fVar37));
          local_1340._28_4_ = uVar186 ^ (uint)(auVar43._28_4_ + auVar44._28_4_ + 0.0);
          fVar125 = *(float *)(ray + k * 4 + 0x30);
          fVar94 = local_1320._0_4_;
          fVar95 = local_1320._4_4_;
          auVar66._4_4_ = fVar95 * fVar125;
          auVar66._0_4_ = fVar94 * fVar125;
          fVar96 = local_1320._8_4_;
          auVar66._8_4_ = fVar96 * fVar125;
          fVar98 = local_1320._12_4_;
          auVar66._12_4_ = fVar98 * fVar125;
          fVar100 = local_1320._16_4_;
          auVar66._16_4_ = fVar100 * fVar125;
          fVar97 = local_1320._20_4_;
          auVar66._20_4_ = fVar97 * fVar125;
          fVar99 = local_1320._24_4_;
          auVar66._24_4_ = fVar99 * fVar125;
          auVar66._28_4_ = fVar125;
          auVar102 = vcmpps_avx(auVar66,local_1340,1);
          fVar125 = *(float *)(ray + k * 4 + 0x80);
          auVar67._4_4_ = fVar125 * fVar95;
          auVar67._0_4_ = fVar125 * fVar94;
          auVar67._8_4_ = fVar125 * fVar96;
          auVar67._12_4_ = fVar125 * fVar98;
          auVar67._16_4_ = fVar125 * fVar100;
          auVar67._20_4_ = fVar125 * fVar97;
          auVar67._24_4_ = fVar125 * fVar99;
          auVar67._28_4_ = auVar44._28_4_;
          auVar109 = vcmpps_avx(local_1340,auVar67,2);
          auVar102 = vandps_avx(auVar102,auVar109);
          auVar106 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
          auVar90 = vpand_avx(auVar106,auVar90);
          auVar106 = vpmovzxwd_avx(auVar90);
          auVar106 = vpslld_avx(auVar106,0x1f);
          auVar107 = vpsrad_avx(auVar106,0x1f);
          auVar106 = vpunpckhwd_avx(auVar90,auVar90);
          auVar106 = vpslld_avx(auVar106,0x1f);
          auVar106 = vpsrad_avx(auVar106,0x1f);
          local_12e0._16_16_ = auVar106;
          local_12e0._0_16_ = auVar107;
          if ((((((((local_12e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_12e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_12e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_12e0 >> 0x7f,0) != '\0') ||
                (local_12e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar106 >> 0x3f,0) != '\0') ||
              (local_12e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0xf] < '\0') {
            auVar102 = vsubps_avx(local_1320,auVar154);
            auVar102 = vblendvps_avx(auVar138,auVar102,local_1440);
            auVar40 = vsubps_avx(local_1320,auVar138);
            auVar109 = vblendvps_avx(auVar154,auVar40,local_1440);
            uStack_1244 = auVar40._28_4_;
            local_1260[0] = fVar93 * (float)local_1460._0_4_;
            local_1260[1] = fVar3 * (float)local_1460._4_4_;
            local_1260[2] = fVar13 * fStack_1458;
            local_1260[3] = fVar17 * fStack_1454;
            fStack_1250 = fVar24 * fStack_1450;
            fStack_124c = fVar31 * fStack_144c;
            fStack_1248 = fVar38 * fStack_1448;
            local_1240[0] = (float)local_1460._0_4_ * fVar133;
            local_1240[1] = (float)local_1460._4_4_ * fVar141;
            local_1240[2] = fStack_1458 * fVar142;
            local_1240[3] = fStack_1454 * fVar143;
            fStack_1230 = fStack_1450 * fVar144;
            fStack_122c = fStack_144c * fVar145;
            fStack_1228 = fStack_1448 * fVar146;
            uStack_1224 = uStack_1244;
            local_1220[0] = (float)local_1460._0_4_ * fVar89;
            local_1220[1] = (float)local_1460._4_4_ * fVar2;
            local_1220[2] = fStack_1458 * fVar12;
            local_1220[3] = fStack_1454 * fVar16;
            fStack_1210 = fStack_1450 * fVar23;
            fStack_120c = fStack_144c * fVar30;
            fStack_1208 = fStack_1448 * fVar37;
            uStack_1204 = uStack_1244;
            auVar106 = vpshufd_avx(ZEXT416(uVar79),0);
            auVar106 = vpaddd_avx(auVar106,_DAT_01f76ad0);
            auVar107 = vpshufd_avx(ZEXT416(uVar80),0);
            auVar107 = vpaddd_avx(auVar107,_DAT_01f76ae0);
            auVar128._0_4_ = (float)(int)(*(ushort *)(local_1680 + 8 + lVar77) - 1);
            auVar128._4_12_ = auVar45._4_12_;
            auVar105 = vrcpss_avx(auVar128,auVar128);
            auVar172._0_4_ = (float)(int)(*(ushort *)(local_1680 + 10 + lVar77) - 1);
            auVar172._4_12_ = auVar45._4_12_;
            auVar116 = vrcpss_avx(auVar172,auVar172);
            auVar115._16_16_ = auVar106;
            auVar115._0_16_ = auVar106;
            auVar40 = vcvtdq2ps_avx(auVar115);
            fStack_1364 = auVar102._28_4_ + auVar40._28_4_;
            auVar106 = ZEXT416((uint)(auVar105._0_4_ * (2.0 - auVar105._0_4_ * auVar128._0_4_)));
            auVar106 = vshufps_avx(auVar106,auVar106,0);
            local_1380 = (auVar102._0_4_ + fVar94 * auVar40._0_4_) * auVar106._0_4_;
            fStack_137c = (auVar102._4_4_ + fVar95 * auVar40._4_4_) * auVar106._4_4_;
            fStack_1378 = (auVar102._8_4_ + fVar96 * auVar40._8_4_) * auVar106._8_4_;
            fStack_1374 = (auVar102._12_4_ + fVar98 * auVar40._12_4_) * auVar106._12_4_;
            fStack_1370 = (auVar102._16_4_ + fVar100 * auVar40._16_4_) * auVar106._0_4_;
            fStack_136c = (auVar102._20_4_ + fVar97 * auVar40._20_4_) * auVar106._4_4_;
            fStack_1368 = (auVar102._24_4_ + fVar99 * auVar40._24_4_) * auVar106._8_4_;
            auVar119._16_16_ = auVar107;
            auVar119._0_16_ = auVar107;
            auVar102 = vcvtdq2ps_avx(auVar119);
            fStack_1344 = auVar102._28_4_ + auVar109._28_4_;
            auVar106 = ZEXT416((uint)((2.0 - auVar172._0_4_ * auVar116._0_4_) * auVar116._0_4_));
            auVar106 = vshufps_avx(auVar106,auVar106,0);
            local_1360 = (fVar94 * auVar102._0_4_ + auVar109._0_4_) * auVar106._0_4_;
            fStack_135c = (fVar95 * auVar102._4_4_ + auVar109._4_4_) * auVar106._4_4_;
            fStack_1358 = (fVar96 * auVar102._8_4_ + auVar109._8_4_) * auVar106._8_4_;
            fStack_1354 = (fVar98 * auVar102._12_4_ + auVar109._12_4_) * auVar106._12_4_;
            fStack_1350 = (fVar100 * auVar102._16_4_ + auVar109._16_4_) * auVar106._0_4_;
            fStack_134c = (fVar97 * auVar102._20_4_ + auVar109._20_4_) * auVar106._4_4_;
            fStack_1348 = (fVar99 * auVar102._24_4_ + auVar109._24_4_) * auVar106._8_4_;
            if ((local_1580->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_1580->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01014854:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_0101486e;
              }
              auStack_1578 = auVar9._8_24_;
              auVar102 = vrcpps_avx(local_1320);
              fVar89 = auVar102._0_4_;
              fVar93 = auVar102._4_4_;
              auVar68._4_4_ = fVar95 * fVar93;
              auVar68._0_4_ = fVar94 * fVar89;
              fVar94 = auVar102._8_4_;
              auVar68._8_4_ = fVar96 * fVar94;
              fVar95 = auVar102._12_4_;
              auVar68._12_4_ = fVar98 * fVar95;
              fVar96 = auVar102._16_4_;
              auVar68._16_4_ = fVar100 * fVar96;
              fVar98 = auVar102._20_4_;
              auVar68._20_4_ = fVar97 * fVar98;
              fVar100 = auVar102._24_4_;
              auVar68._24_4_ = fVar99 * fVar100;
              auVar68._28_4_ = local_1320._28_4_;
              auVar139._8_4_ = 0x3f800000;
              auVar139._0_8_ = 0x3f8000003f800000;
              auVar139._12_4_ = 0x3f800000;
              auVar139._16_4_ = 0x3f800000;
              auVar139._20_4_ = 0x3f800000;
              auVar139._24_4_ = 0x3f800000;
              auVar139._28_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar139,auVar68);
              fVar89 = fVar89 + fVar89 * auVar109._0_4_;
              fVar93 = fVar93 + fVar93 * auVar109._4_4_;
              fVar94 = fVar94 + fVar94 * auVar109._8_4_;
              fVar95 = fVar95 + fVar95 * auVar109._12_4_;
              fVar96 = fVar96 + fVar96 * auVar109._16_4_;
              fVar98 = fVar98 + fVar98 * auVar109._20_4_;
              fVar100 = fVar100 + fVar100 * auVar109._24_4_;
              local_1280[0] = fVar89 * local_1340._0_4_;
              local_1280[1] = fVar93 * local_1340._4_4_;
              local_1280[2] = fVar94 * local_1340._8_4_;
              local_1280[3] = fVar95 * local_1340._12_4_;
              fStack_1270 = fVar96 * local_1340._16_4_;
              fStack_126c = fVar98 * local_1340._20_4_;
              fStack_1268 = fVar100 * local_1340._24_4_;
              uStack_1264 = local_1340._28_4_;
              local_12c0[0] = local_1380 * fVar89;
              local_12c0[1] = fStack_137c * fVar93;
              local_12c0[2] = fStack_1378 * fVar94;
              local_12c0[3] = fStack_1374 * fVar95;
              fStack_12b0 = fStack_1370 * fVar96;
              fStack_12ac = fStack_136c * fVar98;
              fStack_12a8 = fStack_1368 * fVar100;
              uStack_12a4 = local_1340._28_4_;
              local_12a0[0] = local_1360 * fVar89;
              local_12a0[1] = fStack_135c * fVar93;
              local_12a0[2] = fStack_1358 * fVar94;
              local_12a0[3] = fStack_1354 * fVar95;
              fStack_1290 = fStack_1350 * fVar96;
              fStack_128c = fStack_134c * fVar98;
              fStack_1288 = fStack_1348 * fVar100;
              fStack_1284 = auVar102._28_4_ + auVar109._28_4_;
              auVar90 = vpsllw_avx(auVar90,0xf);
              auVar90 = vpacksswb_avx(auVar90,auVar90);
              bVar48 = SUB161(auVar90 >> 7,0) & 1 | (SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                       (SUB161(auVar90 >> 0x17,0) & 1) << 2 | (SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                       (SUB161(auVar90 >> 0x27,0) & 1) << 4 | (SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                       (SUB161(auVar90 >> 0x37,0) & 1) << 6 | SUB161(auVar90 >> 0x3f,0) << 7;
              uVar81 = (ulong)bVar48;
              uVar78 = 0;
              if (uVar81 != 0) {
                for (; (bVar48 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
                }
              }
              local_15a0 = vpshufd_avx(ZEXT416(*(uint *)(local_1648 + 0x88)),0);
              auStack_1590 = auVar39._16_16_;
              local_15c0 = vpshufd_avx(ZEXT416(uVar72),0);
              auStack_15b0 = auVar42._16_16_;
              fStack_163c = fVar125;
              local_1640 = fVar125;
              fStack_1638 = fVar125;
              fStack_1634 = fVar125;
              fStack_1630 = fVar125;
              fStack_162c = fVar125;
              fStack_1628 = fVar125;
              fStack_1624 = fVar125;
              while (pGVar70 = local_1580, uVar81 != 0) {
                local_14c0 = local_12c0[uVar78];
                local_14b0 = local_12a0[uVar78];
                *(float *)(ray + k * 4 + 0x80) = local_1280[uVar78];
                local_1610.context = context->user;
                local_14f0 = local_1260[uVar78];
                local_14e0 = local_1240[uVar78];
                local_14d0 = local_1220[uVar78];
                local_14a0 = local_15c0._0_8_;
                uStack_1498 = local_15c0._8_8_;
                local_1490 = local_15a0;
                vcmpps_avx(ZEXT1632(local_15a0),ZEXT1632(local_15a0),0xf);
                uStack_147c = (local_1610.context)->instID[0];
                local_1480 = uStack_147c;
                uStack_1478 = uStack_147c;
                uStack_1474 = uStack_147c;
                uStack_1470 = (local_1610.context)->instPrimID[0];
                uStack_146c = uStack_1470;
                uStack_1468 = uStack_1470;
                uStack_1464 = uStack_1470;
                local_16f0 = *local_16e0;
                local_1610.valid = (int *)local_16f0;
                local_1610.geometryUserPtr = *(void **)((long)local_1580 + 0x18);
                local_1610.hit = (RTCHitN *)&local_14f0;
                local_1610.N = 4;
                local_1610.ray = (RTCRayN *)ray;
                fStack_14ec = local_14f0;
                fStack_14e8 = local_14f0;
                fStack_14e4 = local_14f0;
                fStack_14dc = local_14e0;
                fStack_14d8 = local_14e0;
                fStack_14d4 = local_14e0;
                fStack_14cc = local_14d0;
                fStack_14c8 = local_14d0;
                fStack_14c4 = local_14d0;
                fStack_14bc = local_14c0;
                fStack_14b8 = local_14c0;
                fStack_14b4 = local_14c0;
                fStack_14ac = local_14b0;
                fStack_14a8 = local_14b0;
                fStack_14a4 = local_14b0;
                if (*(code **)((long)local_1580 + 0x48) != (code *)0x0) {
                  (**(code **)((long)local_1580 + 0x48))(&local_1610);
                  fVar125 = local_1640;
                  fVar205 = local_15e0;
                  fVar207 = fStack_15dc;
                  fVar208 = fStack_15d8;
                  fVar209 = fStack_15d4;
                  fVar210 = fStack_15d0;
                  fVar211 = fStack_15cc;
                  fVar212 = fStack_15c8;
                }
                if (local_16f0 == (undefined1  [16])0x0) {
                  auVar90 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar90 = auVar90 ^ _DAT_01f46b70;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)pGVar70 + 0x3e) & 0x40) != 0)))) {
                    (*p_Var8)(&local_1610);
                    fVar125 = local_1640;
                    fVar205 = local_15e0;
                    fVar207 = fStack_15dc;
                    fVar208 = fStack_15d8;
                    fVar209 = fStack_15d4;
                    fVar210 = fStack_15d0;
                    fVar211 = fStack_15cc;
                    fVar212 = fStack_15c8;
                  }
                  auVar106 = vpcmpeqd_avx(local_16f0,_DAT_01f45a50);
                  auVar90 = auVar106 ^ _DAT_01f46b70;
                  auVar108._8_4_ = 0xff800000;
                  auVar108._0_8_ = 0xff800000ff800000;
                  auVar108._12_4_ = 0xff800000;
                  auVar106 = vblendvps_avx(auVar108,*(undefined1 (*) [16])(local_1610.ray + 0x80),
                                           auVar106);
                  *(undefined1 (*) [16])(local_1610.ray + 0x80) = auVar106;
                }
                auVar101._8_8_ = 0x100000001;
                auVar101._0_8_ = 0x100000001;
                if ((auVar101 & auVar90) != (undefined1  [16])0x0) goto LAB_01014854;
                *(float *)(ray + k * 4 + 0x80) = fVar125;
                uVar81 = uVar81 ^ 1L << (uVar78 & 0x3f);
                uVar78 = 0;
                if (uVar81 != 0) {
                  for (; (uVar81 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
                  }
                }
              }
            }
          }
        }
        auVar197 = ZEXT3264(local_13a0);
        uVar78 = local_1650;
        uVar81 = local_1658;
        uVar82 = local_1660;
        uVar83 = local_1668;
        uVar84 = local_1670;
        uVar87 = local_1678;
      }
      auVar124 = ZEXT3264(local_13c0);
      auVar140 = ZEXT3264(local_13e0);
      unaff_RBX = 0;
      fVar125 = local_1400;
      fVar95 = fStack_13fc;
      fVar96 = fStack_13f8;
      fVar98 = fStack_13f4;
      fVar100 = fStack_13f0;
      fVar97 = fStack_13ec;
      fVar89 = fStack_13e8;
      fVar94 = local_1420;
      fVar93 = fStack_141c;
      fVar99 = fStack_1418;
      fVar155 = fStack_1414;
      fVar156 = fStack_1410;
      fVar157 = fStack_140c;
      fVar158 = fStack_1408;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }